

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void checkList(IntegrityCk *pCheck,int isFreeList,Pgno iPage,u32 N)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint *puVar5;
  int iVar6;
  BtShared *pBVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  u32 uVar11;
  uint uVar12;
  uint uVar13;
  u32 uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  DbPage *pOvflPage;
  DbPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = pCheck->nErr;
  uVar11 = N;
  uVar14 = N;
  if (iPage != 0) {
    do {
      uVar11 = uVar14;
      if (pCheck->mxErr == 0) break;
      local_40 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
      iVar6 = checkRef(pCheck,iPage);
      if (iVar6 != 0) break;
      uVar11 = uVar14 - 1;
      iVar6 = (*pCheck->pPager->xGet)(pCheck->pPager,iPage,&local_40,0);
      if (iVar6 != 0) {
        checkAppendMsg(pCheck,"failed to get page %u",(ulong)iPage);
        break;
      }
      puVar5 = (uint *)local_40->pData;
      if (isFreeList == 0) {
        if ((pCheck->pBt->autoVacuum != '\0') && (uVar11 != 0)) {
          uVar10 = *puVar5;
          checkPtrmap(pCheck,uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                             uVar10 << 0x18,'\x04',iPage);
        }
      }
      else {
        uVar10 = puVar5[1];
        bVar1 = *(byte *)((long)puVar5 + 5);
        bVar2 = *(byte *)((long)puVar5 + 6);
        bVar3 = *(byte *)((long)puVar5 + 7);
        pBVar7 = pCheck->pBt;
        if (pBVar7->autoVacuum != '\0') {
          checkPtrmap(pCheck,iPage,'\x02',0);
          pBVar7 = pCheck->pBt;
        }
        iVar6 = (uint)(byte)uVar10 * 0x1000000;
        iVar8 = (uint)bVar1 * 0x10000;
        uVar12 = (uint)bVar2 * 0x100;
        uVar10 = iVar8 + iVar6 | uVar12 | (uint)bVar3;
        if ((pBVar7->usableSize >> 2) - 2 < uVar10) {
          checkAppendMsg(pCheck,"freelist leaf count too big on page %u",(ulong)iPage);
          uVar11 = uVar14 - 2;
        }
        else {
          if (0 < (int)uVar10) {
            uVar15 = 0;
            do {
              uVar13 = puVar5[uVar15 + 2];
              uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 << 0x18;
              if (pCheck->pBt->autoVacuum != '\0') {
                checkPtrmap(pCheck,uVar13,'\x02',0);
              }
              checkRef(pCheck,uVar13);
              uVar15 = uVar15 + 1;
            } while (uVar12 + bVar3 + iVar6 + iVar8 != uVar15);
          }
          uVar11 = uVar11 - uVar10;
        }
      }
      uVar10 = *puVar5;
      if (local_40 != (DbPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_40);
      }
      iPage = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      uVar14 = uVar11;
    } while (iPage != 0);
  }
  if ((uVar11 != 0) && (iVar4 == pCheck->nErr)) {
    pcVar9 = "size";
    if (isFreeList == 0) {
      pcVar9 = "overflow list length";
    }
    checkAppendMsg(pCheck,"%s is %u but should be %u",pcVar9,(ulong)(N - uVar11));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  Pgno iPage,           /* Page number for first page in the list */
  u32 N                 /* Expected number of pages in the list */
){
  int i;
  u32 expected = N;
  int nErrAtStart = pCheck->nErr;
  while( iPage!=0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( checkRef(pCheck, iPage) ) break;
    N--;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %u", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      u32 n = (u32)get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %u", iPage);
        N--;
      }else{
        for(i=0; i<(int)n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
  if( N && nErrAtStart==pCheck->nErr ){
    checkAppendMsg(pCheck,
      "%s is %u but should be %u",
      isFreeList ? "size" : "overflow list length",
      expected-N, expected);
  }
}